

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O3

int ABC_AddGate(ABC_Manager mng,GateType type,char *name,int nofi,char **fanins,int dc_attr)

{
  Mem_Flex_t *p;
  int iVar1;
  size_t sVar2;
  char *__dest;
  Abc_Obj_t *pObj;
  char *pcVar3;
  ulong uVar4;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *local_40;
  char *local_38;
  
  p = mng->pMmNames;
  sVar2 = strlen(name);
  __dest = Mem_FlexEntryFetch(p,(int)sVar2 + 1);
  strcpy(__dest,name);
  if (type < CSAT_BCNF) {
    if ((0x7f9U >> (type & (CSAT_BBUS|CSAT_BTRIL)) & 1) == 0) {
      if ((6U >> (type & (CSAT_BBUS|CSAT_BTRIL)) & 1) == 0) {
        if ((0x60000U >> (type & (CSAT_BBUS|CSAT_BTRIL)) & 1) == 0) goto LAB_004ff9ad;
        if (nofi != 1) {
          pcVar3 = "ABC_AddGate: The PO/PPO gate \"%s\" does not have exactly one fanin.\n";
          goto LAB_004ffbdc;
        }
        pObj = Abc_NtkCreateObj(mng->pNtk,ABC_OBJ_PO);
        stmm_insert(mng->tNode2Name,(char *)pObj,__dest);
        iVar1 = stmm_lookup(mng->tName2Node,*fanins,(char **)&local_40);
        if (iVar1 == 0) {
          __dest = *fanins;
LAB_004ff983:
          pcVar3 = "ABC_AddGate: The fanin gate \"%s\" is not in the network.\n";
          goto LAB_004ffbdc;
        }
        Abc_ObjAddFanin(pObj,local_40);
      }
      else {
        if (nofi != 0) {
          pcVar3 = "ABC_AddGate: The PI/PPI gate \"%s\" has fanins.\n";
          goto LAB_004ffbdc;
        }
        pObj = Abc_NtkCreateObj(mng->pNtk,ABC_OBJ_PI);
        stmm_insert(mng->tNode2Name,(char *)pObj,__dest);
      }
    }
    else {
      local_38 = __dest;
      pObj = Abc_NtkCreateObj(mng->pNtk,ABC_OBJ_NODE);
      if (0 < nofi) {
        uVar4 = 0;
        do {
          iVar1 = stmm_lookup(mng->tName2Node,fanins[uVar4],(char **)&local_40);
          if (iVar1 == 0) {
            __dest = fanins[uVar4];
            goto LAB_004ff983;
          }
          Abc_ObjAddFanin(pObj,local_40);
          uVar4 = uVar4 + 1;
        } while ((uint)nofi != uVar4);
      }
      __dest = local_38;
      pcVar3 = (char *)0x0;
      switch(type) {
      case CSAT_CONST:
        if (nofi != 0) {
          pcVar3 = "ABC_AddGate: The constant gate \"%s\" has fanins.\n";
          goto LAB_004ffbdc;
        }
        pcVar3 = Abc_SopCreateConst1((Mem_Flex_t *)mng->pNtk->pManFunc);
        break;
      case CSAT_BAND:
        if (nofi < 1) {
          pcVar3 = "ABC_AddGate: The AND gate \"%s\" no fanins.\n";
          goto LAB_004ffbdc;
        }
        pcVar3 = Abc_SopCreateAnd((Mem_Flex_t *)mng->pNtk->pManFunc,nofi,(int *)0x0);
        break;
      case CSAT_BNAND:
        if (nofi < 1) {
          pcVar3 = "ABC_AddGate: The NAND gate \"%s\" no fanins.\n";
          goto LAB_004ffbdc;
        }
        pcVar3 = Abc_SopCreateNand((Mem_Flex_t *)mng->pNtk->pManFunc,nofi);
        break;
      case CSAT_BOR:
        if (nofi < 1) {
          pcVar3 = "ABC_AddGate: The OR gate \"%s\" no fanins.\n";
          goto LAB_004ffbdc;
        }
        pcVar3 = Abc_SopCreateOr((Mem_Flex_t *)mng->pNtk->pManFunc,nofi,(int *)0x0);
        break;
      case CSAT_BNOR:
        if (nofi < 1) {
          pcVar3 = "ABC_AddGate: The NOR gate \"%s\" no fanins.\n";
          goto LAB_004ffbdc;
        }
        pcVar3 = Abc_SopCreateNor((Mem_Flex_t *)mng->pNtk->pManFunc,nofi);
        break;
      case CSAT_BXOR:
        if (nofi < 1) {
          pcVar3 = "ABC_AddGate: The XOR gate \"%s\" no fanins.\n";
          goto LAB_004ffbdc;
        }
        if (2 < (uint)nofi) {
          pcVar3 = "ABC_AddGate: The XOR gate \"%s\" has more than two fanins.\n";
          goto LAB_004ffbdc;
        }
        pcVar3 = Abc_SopCreateXor((Mem_Flex_t *)mng->pNtk->pManFunc,nofi);
        break;
      case CSAT_BXNOR:
        if (nofi < 1) {
          pcVar3 = "ABC_AddGate: The XNOR gate \"%s\" no fanins.\n";
          goto LAB_004ffbdc;
        }
        if (2 < (uint)nofi) {
          pcVar3 = "ABC_AddGate: The XNOR gate \"%s\" has more than two fanins.\n";
          goto LAB_004ffbdc;
        }
        pcVar3 = Abc_SopCreateNxor((Mem_Flex_t *)mng->pNtk->pManFunc,nofi);
        break;
      case CSAT_BINV:
        if (nofi != 1) {
          pcVar3 = "ABC_AddGate: The inverter gate \"%s\" does not have exactly one fanin.\n";
          goto LAB_004ffbdc;
        }
        pcVar3 = Abc_SopCreateInv((Mem_Flex_t *)mng->pNtk->pManFunc);
        break;
      case CSAT_BBUF:
        if (nofi != 1) {
          pcVar3 = "ABC_AddGate: The buffer gate \"%s\" does not have exactly one fanin.\n";
          goto LAB_004ffbdc;
        }
        pcVar3 = Abc_SopCreateBuf((Mem_Flex_t *)mng->pNtk->pManFunc);
      }
      (pObj->field_5).pData = pcVar3;
    }
  }
  else {
LAB_004ff9ad:
    puts("ABC_AddGate: Unknown gate type.");
    pObj = (Abc_Obj_t *)0x0;
  }
  iVar1 = stmm_insert(mng->tName2Node,__dest,(char *)pObj);
  if (iVar1 == 0) {
    return 1;
  }
  pcVar3 = "ABC_AddGate: The same gate \"%s\" is added twice.\n";
LAB_004ffbdc:
  printf(pcVar3,__dest);
  return 0;
}

Assistant:

int ABC_AddGate( ABC_Manager mng, enum GateType type, char * name, int nofi, char ** fanins, int dc_attr )
{
    Abc_Obj_t * pObj = NULL; // Suppress "might be used uninitialized"
    Abc_Obj_t * pFanin;
    char * pSop = NULL; // Suppress "might be used uninitialized"
    char * pNewName;
    int i;

    // save the name in the local memory manager
    pNewName = Mem_FlexEntryFetch( mng->pMmNames, strlen(name) + 1 );
    strcpy( pNewName, name );
    name = pNewName;

    // consider different cases, create the node, and map the node into the name
    switch( type )
    {
    case CSAT_BPI:
    case CSAT_BPPI:
        if ( nofi != 0 )
            { printf( "ABC_AddGate: The PI/PPI gate \"%s\" has fanins.\n", name ); return 0; }
        // create the PI
        pObj = Abc_NtkCreatePi( mng->pNtk );
        stmm_insert( mng->tNode2Name, (char *)pObj, name );
        break;
    case CSAT_CONST:
    case CSAT_BAND:
    case CSAT_BNAND:
    case CSAT_BOR:
    case CSAT_BNOR:
    case CSAT_BXOR:
    case CSAT_BXNOR:
    case CSAT_BINV:
    case CSAT_BBUF:
        // create the node
        pObj = Abc_NtkCreateNode( mng->pNtk );
        // create the fanins
        for ( i = 0; i < nofi; i++ )
        {
            if ( !stmm_lookup( mng->tName2Node, fanins[i], (char **)&pFanin ) )
                { printf( "ABC_AddGate: The fanin gate \"%s\" is not in the network.\n", fanins[i] ); return 0; }
            Abc_ObjAddFanin( pObj, pFanin );
        }
        // create the node function
        switch( type )
        {
            case CSAT_CONST:
                if ( nofi != 0 )
                    { printf( "ABC_AddGate: The constant gate \"%s\" has fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateConst1( (Mem_Flex_t *)mng->pNtk->pManFunc );
                break;
            case CSAT_BAND:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The AND gate \"%s\" no fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateAnd( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi, NULL );
                break;
            case CSAT_BNAND:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The NAND gate \"%s\" no fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateNand( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi );
                break;
            case CSAT_BOR:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The OR gate \"%s\" no fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateOr( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi, NULL );
                break;
            case CSAT_BNOR:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The NOR gate \"%s\" no fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateNor( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi );
                break;
            case CSAT_BXOR:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The XOR gate \"%s\" no fanins.\n", name ); return 0; }
                if ( nofi > 2 )
                    { printf( "ABC_AddGate: The XOR gate \"%s\" has more than two fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateXor( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi );
                break;
            case CSAT_BXNOR:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The XNOR gate \"%s\" no fanins.\n", name ); return 0; }
                if ( nofi > 2 )
                    { printf( "ABC_AddGate: The XNOR gate \"%s\" has more than two fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateNxor( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi );
                break;
            case CSAT_BINV:
                if ( nofi != 1 )
                    { printf( "ABC_AddGate: The inverter gate \"%s\" does not have exactly one fanin.\n", name ); return 0; }
                pSop = Abc_SopCreateInv( (Mem_Flex_t *)mng->pNtk->pManFunc );
                break;
            case CSAT_BBUF:
                if ( nofi != 1 )
                    { printf( "ABC_AddGate: The buffer gate \"%s\" does not have exactly one fanin.\n", name ); return 0; }
                pSop = Abc_SopCreateBuf( (Mem_Flex_t *)mng->pNtk->pManFunc );
                break;
            default :
                break;
        }
        Abc_ObjSetData( pObj, pSop );
        break;
    case CSAT_BPPO:
    case CSAT_BPO:
        if ( nofi != 1 )
            { printf( "ABC_AddGate: The PO/PPO gate \"%s\" does not have exactly one fanin.\n", name ); return 0; }
        // create the PO
        pObj = Abc_NtkCreatePo( mng->pNtk );
        stmm_insert( mng->tNode2Name, (char *)pObj, name );
        // connect to the PO fanin
        if ( !stmm_lookup( mng->tName2Node, fanins[0], (char **)&pFanin ) )
            { printf( "ABC_AddGate: The fanin gate \"%s\" is not in the network.\n", fanins[0] ); return 0; }
        Abc_ObjAddFanin( pObj, pFanin );
        break;
    default:
        printf( "ABC_AddGate: Unknown gate type.\n" );
        break;
    }

    // map the name into the node
    if ( stmm_insert( mng->tName2Node, name, (char *)pObj ) )
        { printf( "ABC_AddGate: The same gate \"%s\" is added twice.\n", name ); return 0; }
    return 1;
}